

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# velocypack-common.h
# Opt level: O0

void arangodb::velocypack::storeVariableValueLength<false>(uint8_t *dst,ValueLength value)

{
  ValueLength value_local;
  uint8_t *dst_local;
  
  dst_local = dst;
  for (value_local = value; 0x7f < value_local; value_local = value_local >> 7) {
    *dst_local = (byte)value_local | 0x80;
    dst_local = dst_local + 1;
  }
  *dst_local = (byte)value_local & 0x7f;
  return;
}

Assistant:

static inline void storeVariableValueLength(uint8_t* dst,
                                            ValueLength value) noexcept {
  VELOCYPACK_ASSERT(value > 0);

  if (reverse) {
    while (value >= 0x80U) {
      *dst-- = static_cast<uint8_t>(value | 0x80U);
      value >>= 7;
    }
    *dst = static_cast<uint8_t>(value & 0x7fU);
  } else {
    while (value >= 0x80U) {
      *dst++ = static_cast<uint8_t>(value | 0x80U);
      value >>= 7;
    }
    *dst = static_cast<uint8_t>(value & 0x7fU);
  }
}